

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_iterator.hpp
# Opt level: O2

union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_iterator<double>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_iterator<double>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_iterator<double>_>_>_>_>,_std::less<void>_>
* __thiscall
burst::
make_union_iterator<std::vector<boost::iterator_range<std::_Fwd_list_iterator<double>>,std::allocator<boost::iterator_range<std::_Fwd_list_iterator<double>>>>&>
          (union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_iterator<double>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_iterator<double>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_iterator<double>_>_>_>_>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,
          vector<boost::iterator_range<std::_Fwd_list_iterator<double>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_iterator<double>_>_>_>
          *ranges)

{
  union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_iterator<double>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_iterator<double>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_iterator<double>_>_>_>_>,_std::less<void>_>
  ::union_iterator(__return_storage_ptr__,*(undefined8 *)this,*(undefined8 *)(this + 8));
  return __return_storage_ptr__;
}

Assistant:

auto make_union_iterator (RandomAccessRange && ranges)
    {
        using std::begin;
        using std::end;
        return
            make_union_iterator
            (
                begin(std::forward<RandomAccessRange>(ranges)),
                end(std::forward<RandomAccessRange>(ranges))
            );
    }